

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_cwksp.h
# Opt level: O0

size_t ZSTD_cwksp_alloc_size(size_t size)

{
  size_t size_local;
  
  size_local = size;
  if (size == 0) {
    size_local = 0;
  }
  return size_local;
}

Assistant:

MEM_STATIC size_t ZSTD_cwksp_alloc_size(size_t size) {
    if (size == 0)
        return 0;
#if ZSTD_ADDRESS_SANITIZER && !defined (ZSTD_ASAN_DONT_POISON_WORKSPACE)
    return size + 2 * ZSTD_CWKSP_ASAN_REDZONE_SIZE;
#else
    return size;
#endif
}